

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  bool bVar1;
  U32 UVar2;
  int iVar3;
  uint uVar4;
  ZSTD_nextInputType_e ZVar5;
  ulong __n;
  ZSTD_DDict *pZVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  bool bVar11;
  ulong local_1e8;
  size_t local_1d8;
  uint local_1bc;
  unsigned_long_long local_1b8;
  size_t local_180;
  void *local_170;
  void *local_168;
  char *local_160;
  char *local_158;
  size_t nextSrcSizeHint;
  size_t flushedSize;
  size_t toFlushSize;
  size_t decodedSize_1;
  size_t loadedSize;
  int isSkipFrame_1;
  size_t toLoad_1;
  size_t neededInSize_1;
  size_t decodedSize;
  int isSkipFrame;
  size_t neededInSize;
  size_t bufferSize;
  int tooLarge;
  int tooSmall;
  size_t neededOutBuffSize;
  size_t neededInBuffSize;
  size_t err_code_1;
  size_t err_code;
  size_t decompressedSize;
  size_t cSize;
  size_t remainingInput;
  size_t toLoad;
  size_t hSize;
  void *pvStack_68;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *dst;
  char *ip;
  char *iend;
  char *istart;
  char *src;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_DStream *zds_local;
  
  local_160 = (char *)input->src;
  local_158 = local_160;
  if (input->pos != 0) {
    local_158 = local_160 + input->pos;
  }
  if (input->size != 0) {
    local_160 = local_160 + input->size;
  }
  dst = local_158;
  local_170 = output->dst;
  local_168 = local_170;
  if (output->pos != 0) {
    local_168 = (void *)((long)local_170 + output->pos);
  }
  if (output->size != 0) {
    local_170 = (void *)((long)local_170 + output->size);
  }
  pvStack_68 = local_168;
  bVar1 = true;
  if (input->size < input->pos) {
    zds_local = (ZSTD_DStream *)0xffffffffffffffb8;
  }
  else if (output->size < output->pos) {
    zds_local = (ZSTD_DStream *)0xffffffffffffffba;
  }
  else {
LAB_001dfd6c:
    if (bVar1) {
      switch(zds->streamStage) {
      case zdss_init:
        goto switchD_001dfda6_caseD_0;
      case zdss_loadHeader:
        goto switchD_001dfda6_caseD_1;
      case zdss_read:
        goto switchD_001dfda6_caseD_2;
      case zdss_load:
        goto switchD_001dfda6_caseD_3;
      case zdss_flush:
        goto switchD_001dfda6_caseD_4;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6080,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
    }
    input->pos = (long)dst - (long)input->src;
    output->pos = (long)pvStack_68 - (long)output->dst;
    if ((dst == local_158) && (pvStack_68 == local_168)) {
      zds->noForwardProgress = zds->noForwardProgress + 1;
      if (0xf < zds->noForwardProgress) {
        if (pvStack_68 == local_170) {
          return 0xffffffffffffffba;
        }
        if (dst == local_160) {
          return 0xffffffffffffffb8;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x608c,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
    }
    else {
      zds->noForwardProgress = 0;
    }
    sVar9 = ZSTD_nextSrcSizeToDecompress(zds);
    if (sVar9 == 0) {
      if (zds->outEnd == zds->outStart) {
        if (zds->hostageByte != 0) {
          if (input->size <= input->pos) {
            zds->streamStage = zdss_read;
            return 1;
          }
          input->pos = input->pos + 1;
        }
        zds_local = (ZSTD_DStream *)0x0;
      }
      else {
        if (zds->hostageByte == 0) {
          input->pos = input->pos - 1;
          zds->hostageByte = 1;
        }
        zds_local = (ZSTD_DStream *)0x1;
      }
    }
    else {
      ZVar5 = ZSTD_nextInputType(zds);
      uVar10 = (ulong)(ZVar5 == ZSTDnit_block) * 3 + sVar9;
      if (uVar10 < zds->inPos) {
        __assert_fail("zds->inPos <= nextSrcSizeHint",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x60a5,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
      zds_local = (ZSTD_DStream *)(uVar10 - zds->inPos);
    }
  }
  return (size_t)zds_local;
switchD_001dfda6_caseD_0:
  zds->streamStage = zdss_loadHeader;
  zds->outEnd = 0;
  zds->outStart = 0;
  zds->inPos = 0;
  zds->lhSize = 0;
  zds->legacyVersion = 0;
  zds->hostageByte = 0;
switchD_001dfda6_caseD_1:
  local_180 = ZSTD_getFrameHeader_advanced(&zds->fParams,zds->headerBuffer,zds->lhSize,zds->format);
  uVar4 = ZSTD_isError(local_180);
  if (uVar4 != 0) {
    return local_180;
  }
  if (local_180 == 0) {
    if (((((zds->fParams).frameContentSize == 0) || ((zds->fParams).windowSize == 0)) ||
        ((ulong)((long)local_170 - (long)pvStack_68) < (zds->fParams).frameContentSize)) ||
       (sVar9 = ZSTD_findFrameCompressedSize(local_158,(long)local_160 - (long)local_158),
       (ulong)((long)local_160 - (long)local_158) < sVar9)) {
      pZVar6 = ZSTD_getDDict(zds);
      sVar9 = ZSTD_decompressBegin_usingDDict(zds,pZVar6);
      uVar4 = ERR_isError(sVar9);
      if (uVar4 != 0) {
        return sVar9;
      }
      UVar2 = MEM_readLE32(zds->headerBuffer);
      if ((UVar2 & 0xfffffff0) == 0x184d2a50) {
        UVar2 = MEM_readLE32(zds->headerBuffer + 4);
        zds->expected = (ulong)UVar2;
        zds->stage = ZSTDds_skipFrame;
      }
      else {
        sVar9 = ZSTD_decodeFrameHeader(zds,zds->headerBuffer,zds->lhSize);
        uVar4 = ERR_isError(sVar9);
        if (uVar4 != 0) {
          return sVar9;
        }
        zds->expected = 3;
        zds->stage = ZSTDds_decodeBlockHeader;
      }
      if ((zds->fParams).windowSize < 0x401) {
        local_1b8 = 0x400;
      }
      else {
        local_1b8 = (zds->fParams).windowSize;
      }
      (zds->fParams).windowSize = local_1b8;
      if (zds->maxWindowSize < (zds->fParams).windowSize) {
        return 0xfffffffffffffff0;
      }
      if ((zds->fParams).blockSizeMax < 5) {
        local_1bc = 4;
      }
      else {
        local_1bc = (zds->fParams).blockSizeMax;
      }
      uVar10 = (ulong)local_1bc;
      sVar9 = ZSTD_decodingBufferSize_min((zds->fParams).windowSize,(zds->fParams).frameContentSize)
      ;
      ZSTD_DCtx_updateOversizedDuration(zds,uVar10,sVar9);
      bVar11 = true;
      if (uVar10 <= zds->inBuffSize) {
        bVar11 = zds->outBuffSize < sVar9;
      }
      iVar3 = ZSTD_DCtx_isOversizedTooLong(zds);
      if ((bVar11) || (iVar3 != 0)) {
        if (zds->staticSize == 0) {
          ZSTD_free(zds->inBuff,zds->customMem);
          zds->inBuffSize = 0;
          zds->outBuffSize = 0;
          pcVar7 = (char *)ZSTD_malloc(uVar10 + sVar9,zds->customMem);
          zds->inBuff = pcVar7;
          if (zds->inBuff == (char *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        else {
          if (zds->staticSize < 0x27218) {
            __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x6021,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          if (zds->staticSize - 0x27218 < uVar10 + sVar9) {
            return 0xffffffffffffffc0;
          }
        }
        zds->inBuffSize = uVar10;
        zds->outBuff = zds->inBuff + zds->inBuffSize;
        zds->outBuffSize = sVar9;
      }
      zds->streamStage = zdss_read;
switchD_001dfda6_caseD_2:
      sVar9 = ZSTD_nextSrcSizeToDecompressWithInputSize(zds,(long)local_160 - (long)dst);
      if (sVar9 == 0) {
        zds->streamStage = zdss_init;
        bVar1 = false;
      }
      else if ((ulong)((long)local_160 - (long)dst) < sVar9) {
        if (dst == local_160) {
          bVar1 = false;
        }
        else {
          zds->streamStage = zdss_load;
switchD_001dfda6_caseD_3:
          sVar9 = ZSTD_nextSrcSizeToDecompress(zds);
          uVar10 = sVar9 - zds->inPos;
          iVar3 = ZSTD_isSkipFrame(zds);
          sVar8 = ZSTD_nextSrcSizeToDecompressWithInputSize(zds,(long)local_160 - (long)dst);
          if (sVar9 != sVar8) {
            __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x6052,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          if (iVar3 == 0) {
            if (zds->inBuffSize - zds->inPos < uVar10) {
              return 0xffffffffffffffec;
            }
            decodedSize_1 =
                 ZSTD_limitCopy(zds->inBuff + zds->inPos,uVar10,dst,(long)local_160 - (long)dst);
          }
          else {
            local_1e8 = uVar10;
            if ((ulong)((long)local_160 - (long)dst) <= uVar10) {
              local_1e8 = (long)local_160 - (long)dst;
            }
            decodedSize_1 = local_1e8;
          }
          dst = dst + decodedSize_1;
          zds->inPos = decodedSize_1 + zds->inPos;
          if (decodedSize_1 < uVar10) {
            bVar1 = false;
          }
          else {
            sVar9 = ZSTD_decompressContinue
                              (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                               zds->inBuff,sVar9);
            uVar4 = ZSTD_isError(sVar9);
            if (uVar4 != 0) {
              return sVar9;
            }
            zds->inPos = 0;
            if ((sVar9 == 0) && (iVar3 == 0)) {
              zds->streamStage = zdss_read;
            }
            else {
              zds->outEnd = sVar9 + zds->outStart;
              zds->streamStage = zdss_flush;
switchD_001dfda6_caseD_4:
              sVar9 = zds->outEnd - zds->outStart;
              sVar8 = ZSTD_limitCopy(pvStack_68,(long)local_170 - (long)pvStack_68,
                                     zds->outBuff + zds->outStart,sVar9);
              pvStack_68 = (void *)(sVar8 + (long)pvStack_68);
              zds->outStart = sVar8 + zds->outStart;
              if (sVar8 == sVar9) {
                zds->streamStage = zdss_read;
                if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
                   (zds->outBuffSize < zds->outStart + (ulong)(zds->fParams).blockSizeMax)) {
                  zds->outEnd = 0;
                  zds->outStart = 0;
                }
              }
              else {
                bVar1 = false;
              }
            }
          }
        }
      }
      else {
        iVar3 = ZSTD_isSkipFrame(zds);
        if (iVar3 == 0) {
          local_1d8 = zds->outBuffSize - zds->outStart;
        }
        else {
          local_1d8 = 0;
        }
        sVar8 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,local_1d8,dst,sVar9);
        uVar4 = ZSTD_isError(sVar8);
        if (uVar4 != 0) {
          return sVar8;
        }
        dst = dst + sVar9;
        if ((sVar8 != 0) || (iVar3 != 0)) {
          zds->outEnd = sVar8 + zds->outStart;
          zds->streamStage = zdss_flush;
        }
      }
    }
    else {
      pZVar6 = ZSTD_getDDict(zds);
      sVar8 = ZSTD_decompress_usingDDict
                        (zds,pvStack_68,(long)local_170 - (long)pvStack_68,local_158,sVar9,pZVar6);
      uVar4 = ZSTD_isError(sVar8);
      if (uVar4 != 0) {
        return sVar8;
      }
      dst = local_158 + sVar9;
      pvStack_68 = (void *)((long)pvStack_68 + sVar8);
      zds->expected = 0;
      zds->streamStage = zdss_init;
      bVar1 = false;
    }
  }
  else {
    uVar10 = local_180 - zds->lhSize;
    __n = (long)local_160 - (long)dst;
    if (local_160 < dst) {
      __assert_fail("iend >= ip",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5fdc,
                    "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                   );
    }
    if (__n < uVar10) {
      if (__n != 0) {
        memcpy(zds->headerBuffer + zds->lhSize,dst,__n);
        zds->lhSize = __n + zds->lhSize;
      }
      input->pos = input->size;
      iVar3 = 2;
      if (zds->format == ZSTD_f_zstd1) {
        iVar3 = 6;
      }
      if (local_180 < (ulong)(long)iVar3) {
        iVar3 = 2;
        if (zds->format == ZSTD_f_zstd1) {
          iVar3 = 6;
        }
        local_180 = (size_t)iVar3;
      }
      return local_180 + (3 - zds->lhSize);
    }
    if (dst == (char *)0x0) {
      __assert_fail("ip != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5fe5,
                    "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                   );
    }
    memcpy(zds->headerBuffer + zds->lhSize,dst,uVar10);
    zds->lhSize = local_180;
    dst = dst + uVar10;
  }
  goto LAB_001dfd6c;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation);
                        } else {
                            ZSTD_free(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation);
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall);
            RETURN_ERROR_IF(ip==iend, srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}